

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

object * newObj(int cl)

{
  long lVar1;
  object *poVar2;
  object *poVar3;
  object *poVar4;
  int iVar5;
  object *poVar6;
  ulong uVar7;
  size_t __n;
  ulong uVar8;
  
  poVar6 = guard;
  poVar4 = topScope;
  uVar8 = 0xffffffffffffffff;
  do {
    lVar1 = uVar8 + 1;
    uVar8 = uVar8 + 1;
  } while (idName[lVar1] != '\0');
  if (uVar8 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 1;
    if (1 < (int)uVar8) {
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar8 = 0;
    do {
      poVar6->name[uVar8] = idName[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  poVar6->name[uVar7] = '\0';
  poVar6 = poVar4->next;
  iVar5 = stringCompare(idName,poVar6->name);
  poVar3 = guard;
  while (poVar2 = poVar6, guard = poVar3, iVar5 != 0) {
    poVar6 = poVar2->next;
    iVar5 = stringCompare(idName,poVar6->name);
    poVar3 = guard;
    poVar4 = poVar2;
  }
  if (poVar2 == poVar3) {
    poVar6 = (object *)calloc(1,0x90);
    poVar6->cl = cl;
    poVar6->next = poVar3;
    poVar4->next = poVar6;
    uVar8 = 0xffffffffffffffff;
    do {
      lVar1 = uVar8 + 1;
      uVar8 = uVar8 + 1;
    } while (idName[lVar1] != '\0');
    if (uVar8 == 0) {
      __n = 0;
    }
    else {
      __n = 1;
      if (1 < (int)uVar8) {
        __n = uVar8 & 0xffffffff;
      }
      memcpy(poVar6->name,idName,__n);
    }
    poVar6->name[__n] = '\0';
    return poVar6;
  }
  mark("multiple definition");
  exit(-1);
}

Assistant:

object *newObj(int cl) {
	variable int ret;
	variable struct object *newObject; variable struct object *x;
	ret = 0; x = topScope;
	stringCopy(idName,guard->name);
	ret = stringCompare(idName,x->next->name);
	while (ret != 0) {
		x = x->next;
		ret = stringCompare(idName,x->next->name);
	}
	if (x->next == guard) {
		allocMem(newObject);
		newObject->cl = cl;	newObject->next = guard; x->next = newObject;
		stringCopy(idName,newObject->name);	
		return newObject;
	} else {
		mark("multiple definition");
		exit(-1);
	}
}